

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::texture::anon_unknown_0::Texture2DArrayFilteringTestInstance::iterate
          (TestStatus *__return_storage_ptr__,Texture2DArrayFilteringTestInstance *this)

{
  TextureRenderer *this_00;
  ostringstream *poVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  FilterMode FVar5;
  FilterMode FVar6;
  TestLog *pTVar7;
  TestContext *pTVar8;
  undefined8 uVar9;
  bool bVar10;
  int i;
  int iVar11;
  deUint32 dVar12;
  deUint32 dVar13;
  int iVar14;
  TestTexture2DArray *pTVar15;
  undefined4 extraout_var;
  long lVar16;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int i_3;
  pointer pFVar17;
  void *data;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  Texture2DArrayView local_378;
  TestStatus *local_368;
  PixelFormat pixelFormat;
  Surface rendered;
  LodPrecision lodPrecision;
  LookupPrecision local_314;
  IVec4 formatBitDepth;
  TextureFormat texFmt;
  IVec4 colorBits;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  Vector<int,_4> res;
  long local_278;
  int aiStack_270 [2];
  void *local_268;
  undefined4 local_260;
  undefined8 local_25c;
  undefined1 uStack_254;
  undefined3 uStack_253;
  undefined4 uStack_250;
  ios_base local_210 [268];
  ReferenceParams refParams;
  TextureFormatInfo fmtInfo;
  
  pFVar17 = (this->m_cases).
            super__Vector_base<vkt::texture::(anonymous_namespace)::Texture2DArrayFilteringTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::Texture2DArrayFilteringTestInstance::FilterCase>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pTVar7 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  iVar14 = this->m_caseNdx;
  this_00 = &this->m_renderer;
  local_368 = __return_storage_ptr__;
  pTVar15 = util::TextureRenderer::get2DArrayTexture(this_00,pFVar17[iVar14].textureIndex);
  iVar11 = (*(pTVar15->super_TestTexture)._vptr_TestTexture[0xe])();
  texFmt = *(TextureFormat *)CONCAT44(extraout_var,iVar11);
  tcu::getTextureFormatInfo(&fmtInfo,&texFmt);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams(&refParams,TEXTURETYPE_2D_ARRAY);
  dVar12 = util::TextureRenderer::getRenderWidth(this_00);
  dVar13 = util::TextureRenderer::getRenderHeight(this_00);
  tcu::Surface::Surface(&rendered,dVar12,dVar13);
  local_298 = 0;
  uStack_290 = 0;
  local_2a8 = 0;
  uStack_2a0 = 0;
  local_2b8 = 0;
  uStack_2b0 = 0;
  util::createSampler((Sampler *)&res,
                      (this->m_testParameters).super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapS,
                      (this->m_testParameters).super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapT,
                      (this->m_testParameters).super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.minFilter,
                      (this->m_testParameters).super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.magFilter);
  refParams.sampler.magFilter = (undefined4)local_278;
  refParams.sampler.lodThreshold = (float)local_278._4_4_;
  refParams.sampler._24_8_ = aiStack_270;
  refParams.sampler.wrapS = res.m_data[0];
  refParams.sampler.wrapT = res.m_data[1];
  refParams.sampler.wrapR = res.m_data[2];
  refParams.sampler.minFilter = res.m_data[3];
  refParams.sampler._32_8_ = local_268;
  refParams.sampler.borderColor.v.uData[1] = local_260;
  refParams.sampler.borderColor.v._8_8_ = local_25c;
  refParams.sampler.seamlessCubeMap = (bool)uStack_254;
  refParams.sampler._53_3_ = uStack_253;
  refParams.sampler.depthStencilMode = uStack_250;
  refParams.super_RenderParams.samplerType = glu::TextureTestUtil::getSamplerType(texFmt);
  refParams.lodMode = LODMODE_EXACT;
  refParams.super_RenderParams.colorBias.m_data[0] = fmtInfo.lookupBias.m_data[0];
  refParams.super_RenderParams.colorBias.m_data[1] = fmtInfo.lookupBias.m_data[1];
  refParams.super_RenderParams.colorBias.m_data[2] = fmtInfo.lookupBias.m_data[2];
  refParams.super_RenderParams.colorBias.m_data[3] = fmtInfo.lookupBias.m_data[3];
  refParams.super_RenderParams.colorScale.m_data[0] = fmtInfo.lookupScale.m_data[0];
  refParams.super_RenderParams.colorScale.m_data[1] = fmtInfo.lookupScale.m_data[1];
  refParams.super_RenderParams.colorScale.m_data[2] = fmtInfo.lookupScale.m_data[2];
  refParams.super_RenderParams.colorScale.m_data[3] = fmtInfo.lookupScale.m_data[3];
  poVar1 = (ostringstream *)(res.m_data + 2);
  res.m_data._0_8_ = pTVar7;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Approximate lod per axis = ",0x1b);
  pFVar17 = pFVar17 + iVar14;
  tcu::operator<<((ostream *)poVar1,&pFVar17->lod);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", offset = ",0xb);
  tcu::operator<<((ostream *)poVar1,&pFVar17->offset);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_210);
  fVar2 = (pFVar17->lod).m_data[1];
  fVar20 = (pFVar17->offset).m_data[0];
  fVar3 = (pFVar17->offset).m_data[1];
  uVar9 = *(undefined8 *)(pFVar17->offset).m_data;
  fVar18 = expf((pFVar17->lod).m_data[0] * 0.6931472);
  dVar12 = util::TextureRenderer::getRenderWidth(this_00);
  lVar16 = (**(code **)((long)(((this->m_textures).
                                super__Vector_base<de::SharedPtr<vkt::pipeline::TestTexture2DArray>,_std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2DArray>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_ptr->super_TestTexture
                              )._vptr_TestTexture + 0x88))();
  iVar14 = *(int *)(lVar16 + 0x38);
  fVar19 = expf(fVar2 * 0.6931472);
  dVar13 = util::TextureRenderer::getRenderHeight(this_00);
  lVar16 = (**(code **)((long)(((this->m_textures).
                                super__Vector_base<de::SharedPtr<vkt::pipeline::TestTexture2DArray>,_std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2DArray>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_ptr->super_TestTexture
                              )._vptr_TestTexture + 0x88))();
  fVar2 = (pFVar17->layerRange).m_data[0];
  fVar4 = (pFVar17->layerRange).m_data[1];
  fVar21 = (fVar19 * (float)dVar13) / (float)*(int *)(lVar16 + 0x3c) + fVar3;
  fVar19 = fVar2 * 0.5 + fVar4 * 0.5;
  uStack_2b0 = CONCAT44(fVar20,fVar2);
  local_2a8 = CONCAT44(fVar19,fVar21);
  fVar20 = (fVar18 * (float)dVar12) / (float)iVar14 + fVar20;
  uStack_2a0 = CONCAT44(fVar3,fVar20);
  local_298 = CONCAT44(fVar20,fVar19);
  uStack_290 = CONCAT44(fVar4,fVar21);
  local_2b8 = uVar9;
  util::TextureRenderer::renderQuad
            (this_00,&rendered,pFVar17->textureIndex,(float *)&local_2b8,&refParams);
  FVar5 = (this->m_testParameters).super_Texture2DTestCaseParameters.
          super_TextureCommonTestCaseParameters.magFilter;
  FVar6 = (this->m_testParameters).super_Texture2DTestCaseParameters.
          super_TextureCommonTestCaseParameters.minFilter;
  res.m_data._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::getTextureFormatBitDepth((tcu *)&formatBitDepth,(TextureFormat *)&res);
  pixelFormat.redBits = formatBitDepth.m_data[0];
  pixelFormat.greenBits = formatBitDepth.m_data[1];
  pixelFormat.blueBits = formatBitDepth.m_data[2];
  pixelFormat.alphaBits = formatBitDepth.m_data[3];
  local_314.coordBits.m_data[2] = formatBitDepth.m_data[2];
  local_314.uvwBits.m_data[0] = formatBitDepth.m_data[3];
  res.m_data[0] = 0;
  res.m_data[1] = 0;
  res.m_data[2] = 0;
  res.m_data[3] = 0;
  lVar16 = 0;
  do {
    res.m_data[lVar16] =
         local_314.coordBits.m_data[lVar16] + ((FVar5 == NEAREST && FVar6 == NEAREST) | 0xfffffffe);
    lVar16 = lVar16 + 1;
  } while (lVar16 != 4);
  local_378.m_numLevels = 0;
  local_378._4_4_ = 0;
  local_378.m_levels = (ConstPixelBufferAccess *)0x0;
  colorBits.m_data[0] = 0;
  colorBits.m_data[1] = 0;
  colorBits.m_data[2] = 0;
  colorBits.m_data[3] = 0;
  lVar16 = 0;
  do {
    iVar14 = (&local_378.m_numLevels)[lVar16];
    if ((&local_378.m_numLevels)[lVar16] < res.m_data[lVar16]) {
      iVar14 = res.m_data[lVar16];
    }
    colorBits.m_data[lVar16] = iVar14;
    lVar16 = lVar16 + 1;
  } while (lVar16 != 4);
  lodPrecision.rule = RULE_VULKAN;
  lVar16 = 0;
  do {
    local_314.coordBits.m_data[lVar16] = 0x16;
    lVar16 = lVar16 + 1;
  } while (lVar16 != 3);
  lVar16 = 3;
  do {
    local_314.coordBits.m_data[lVar16] = 0x10;
    lVar16 = lVar16 + 1;
  } while (lVar16 != 6);
  local_314.colorThreshold.m_data[0] = 0.0;
  local_314.colorThreshold.m_data[1] = 0.0;
  local_314.colorThreshold.m_data[2] = 0.0;
  local_314.colorThreshold.m_data[3] = 0.0;
  local_314.colorMask.m_data[0] = true;
  local_314.colorMask.m_data[1] = true;
  local_314.colorMask.m_data[2] = true;
  local_314.colorMask.m_data[3] = true;
  lodPrecision.derivateBits = 0x12;
  lodPrecision.lodBits = 6;
  tcu::computeFixedPointThreshold((tcu *)&local_378,&colorBits);
  res.m_data[0] = 0;
  res.m_data[1] = 0;
  res.m_data[2] = 0;
  res.m_data[3] = 0;
  lVar16 = 0;
  do {
    res.m_data[lVar16] =
         (int)((float)(&local_378.m_numLevels)[lVar16] /
              refParams.super_RenderParams.colorScale.m_data[lVar16]);
    lVar16 = lVar16 + 1;
  } while (lVar16 != 4);
  local_314.colorThreshold.m_data[0] = (float)res.m_data[0];
  local_314.colorThreshold.m_data[1] = (float)res.m_data[1];
  local_314.colorThreshold.m_data[2] = (float)res.m_data[2];
  local_314.colorThreshold.m_data[3] = (float)res.m_data[3];
  local_314.coordBits.m_data[0] = 0x14;
  local_314.coordBits.m_data[1] = 0x14;
  local_314.coordBits.m_data[2] = 0x14;
  local_314.uvwBits.m_data[0] = 7;
  local_314.uvwBits.m_data[1] = 7;
  local_314.uvwBits.m_data[2] = 0;
  local_314.colorMask.m_data[1] = 0 < pixelFormat.greenBits;
  local_314.colorMask.m_data[0] = 0 < pixelFormat.redBits;
  local_314.colorMask.m_data[2] = 0 < pixelFormat.blueBits;
  local_314.colorMask.m_data[3] = 0 < pixelFormat.alphaBits;
  pTVar8 = ((this->super_TestInstance).m_context)->m_testCtx;
  local_378.m_numLevels = 8;
  local_378._4_4_ = 3;
  data = (void *)rendered.m_pixels.m_cap;
  if (rendered.m_pixels.m_cap != 0) {
    data = rendered.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&res,(TextureFormat *)&local_378,rendered.m_width,
             rendered.m_height,1,data);
  iVar14 = (*(pTVar15->super_TestTexture)._vptr_TestTexture[0x10])(pTVar15);
  local_378.m_levels = *(ConstPixelBufferAccess **)(CONCAT44(extraout_var_00,iVar14) + 0x50);
  local_378.m_numLevels = *(int *)(CONCAT44(extraout_var_00,iVar14) + 0x48);
  bVar10 = glu::TextureTestUtil::verifyTextureResult
                     (pTVar8,(ConstPixelBufferAccess *)&res,&local_378,(float *)&local_2b8,
                      &refParams,&local_314,&lodPrecision,&pixelFormat);
  if (!bVar10) {
    lodPrecision.lodBits = 4;
    local_314.uvwBits.m_data[0] = 4;
    local_314.uvwBits.m_data[1] = 4;
    local_314.uvwBits.m_data[2] = 0;
    poVar1 = (ostringstream *)(res.m_data + 2);
    res.m_data._0_8_ = pTVar7;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Warning: Verification against high precision requirements failed, trying with lower requirements."
               ,0x61);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_210);
    pTVar8 = ((this->super_TestInstance).m_context)->m_testCtx;
    local_378.m_numLevels = 8;
    local_378._4_4_ = 3;
    if (rendered.m_pixels.m_cap != 0) {
      rendered.m_pixels.m_cap = (size_t)rendered.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&res,(TextureFormat *)&local_378,rendered.m_width,
               rendered.m_height,1,(void *)rendered.m_pixels.m_cap);
    iVar14 = (*(pTVar15->super_TestTexture)._vptr_TestTexture[0x10])(pTVar15);
    local_378.m_levels = *(ConstPixelBufferAccess **)(CONCAT44(extraout_var_01,iVar14) + 0x50);
    local_378.m_numLevels = *(int *)(CONCAT44(extraout_var_01,iVar14) + 0x48);
    bVar10 = glu::TextureTestUtil::verifyTextureResult
                       (pTVar8,(ConstPixelBufferAccess *)&res,&local_378,(float *)&local_2b8,
                        &refParams,&local_314,&lodPrecision,&pixelFormat);
    if (!bVar10) {
      poVar1 = (ostringstream *)(res.m_data + 2);
      res.m_data._0_8_ = pTVar7;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "ERROR: Verification against low precision requirements failed, failing test case."
                 ,0x51);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_210);
      res.m_data._0_8_ = &local_278;
      std::__cxx11::string::_M_construct<char_const*>((string *)&res,"Image verification failed","")
      ;
      local_368->m_code = QP_TEST_RESULT_FAIL;
      (local_368->m_description)._M_dataplus._M_p = (pointer)&(local_368->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_368->m_description,res.m_data._0_8_,
                 res.m_data._8_8_ + res.m_data._0_8_);
      if ((long *)res.m_data._0_8_ != &local_278) {
        operator_delete((void *)res.m_data._0_8_,local_278 + 1);
      }
      if (!bVar10) goto LAB_00801192;
    }
  }
  iVar11 = this->m_caseNdx + 1;
  this->m_caseNdx = iVar11;
  iVar14 = (int)((ulong)((long)(this->m_cases).
                               super__Vector_base<vkt::texture::(anonymous_namespace)::Texture2DArrayFilteringTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::Texture2DArrayFilteringTestInstance::FilterCase>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_cases).
                              super__Vector_base<vkt::texture::(anonymous_namespace)::Texture2DArrayFilteringTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::Texture2DArrayFilteringTestInstance::FilterCase>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 2);
  if (SBORROW4(iVar11,iVar14 * -0x49249249) == iVar11 + iVar14 * 0x49249249 < 0) {
    res.m_data._0_8_ = &local_278;
    std::__cxx11::string::_M_construct<char_const*>((string *)&res,"Pass","");
    local_368->m_code = QP_TEST_RESULT_PASS;
    (local_368->m_description)._M_dataplus._M_p = (pointer)&(local_368->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_368->m_description,res.m_data._0_8_,
               res.m_data._8_8_ + res.m_data._0_8_);
  }
  else {
    tcu::TestStatus::incomplete();
  }
  if ((SBORROW4(iVar11,iVar14 * -0x49249249) == iVar11 + iVar14 * 0x49249249 < 0) &&
     ((long *)res.m_data._0_8_ != &local_278)) {
    operator_delete((void *)res.m_data._0_8_,local_278 + 1);
  }
LAB_00801192:
  tcu::Surface::~Surface(&rendered);
  return local_368;
}

Assistant:

tcu::TestStatus Texture2DArrayFilteringTestInstance::iterate (void)
{
	tcu::TestLog&						log			= m_context.getTestContext().getLog();

	const FilterCase&					curCase		= m_cases[m_caseNdx];
	const pipeline::TestTexture2DArray&	texture		= m_renderer.get2DArrayTexture(curCase.textureIndex);
	const tcu::TextureFormat			texFmt		= texture.getTextureFormat();
	const tcu::TextureFormatInfo		fmtInfo		= tcu::getTextureFormatInfo(texFmt);
	ReferenceParams						refParams	(TEXTURETYPE_2D_ARRAY);
	tcu::Surface						rendered	(m_renderer.getRenderWidth(), m_renderer.getRenderHeight());
	tcu::Vec3							texCoord[4];
	const float* const					texCoordPtr	= (const float*)&texCoord[0];

	// Params for reference computation.

	refParams.sampler		= util::createSampler(m_testParameters.wrapS, m_testParameters.wrapT, m_testParameters.minFilter, m_testParameters.magFilter);
	refParams.samplerType	= getSamplerType(texFmt);
	refParams.lodMode		= LODMODE_EXACT;
	refParams.colorBias		= fmtInfo.lookupBias;
	refParams.colorScale	= fmtInfo.lookupScale;

	// Compute texture coordinates.
	log << TestLog::Message << "Approximate lod per axis = " << curCase.lod << ", offset = " << curCase.offset << TestLog::EndMessage;

	{
		const float	lodX	= curCase.lod.x();
		const float	lodY	= curCase.lod.y();
		const float	oX		= curCase.offset.x();
		const float	oY		= curCase.offset.y();
		const float	sX		= deFloatExp2(lodX) * float(m_renderer.getRenderWidth()) / float(m_textures[0]->getTexture().getWidth());
		const float	sY		= deFloatExp2(lodY) * float(m_renderer.getRenderHeight()) / float(m_textures[0]->getTexture().getHeight());
		const float	l0		= curCase.layerRange.x();
		const float	l1		= curCase.layerRange.y();

		texCoord[0] = tcu::Vec3(oX,		oY,		l0);
		texCoord[1] = tcu::Vec3(oX,		oY+sY,	l0*0.5f + l1*0.5f);
		texCoord[2] = tcu::Vec3(oX+sX,	oY,		l0*0.5f + l1*0.5f);
		texCoord[3] = tcu::Vec3(oX+sX,	oY+sY,	l1);
	}

	m_renderer.renderQuad(rendered, curCase.textureIndex, texCoordPtr, refParams);

	{

		const bool				isNearestOnly	= m_testParameters.minFilter == Sampler::NEAREST && m_testParameters.magFilter == Sampler::NEAREST;
		const tcu::IVec4		formatBitDepth	= getTextureFormatBitDepth(vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM));
		const tcu::PixelFormat	pixelFormat		(formatBitDepth[0], formatBitDepth[1], formatBitDepth[2], formatBitDepth[3]);
		const tcu::IVec4		colorBits		= max(getBitsVec(pixelFormat) - (isNearestOnly ? 1 : 2), tcu::IVec4(0)); // 1 inaccurate bit if nearest only, 2 otherwise
		tcu::LodPrecision		lodPrecision	(tcu::LodPrecision::RULE_VULKAN);
		tcu::LookupPrecision	lookupPrecision;

		lodPrecision.derivateBits		= 18;
		lodPrecision.lodBits			= 6;
		lookupPrecision.colorThreshold	= tcu::computeFixedPointThreshold(colorBits) / refParams.colorScale;
		lookupPrecision.coordBits		= tcu::IVec3(20,20,20);
		lookupPrecision.uvwBits			= tcu::IVec3(7,7,0);
		lookupPrecision.colorMask		= getCompareMask(pixelFormat);

		const bool isHighQuality = verifyTextureResult(m_context.getTestContext(), rendered.getAccess(), (tcu::Texture2DArrayView)texture.getTexture(),
													   texCoordPtr, refParams, lookupPrecision, lodPrecision, pixelFormat);

		if (!isHighQuality)
		{
			// Evaluate against lower precision requirements.
			lodPrecision.lodBits	= 4;
			lookupPrecision.uvwBits	= tcu::IVec3(4,4,0);

			log << TestLog::Message << "Warning: Verification against high precision requirements failed, trying with lower requirements." << TestLog::EndMessage;

			const bool isOk = verifyTextureResult(m_context.getTestContext(), rendered.getAccess(), (tcu::Texture2DArrayView)texture.getTexture(),
												  texCoordPtr, refParams, lookupPrecision, lodPrecision, pixelFormat);

			if (!isOk)
			{
				log << TestLog::Message << "ERROR: Verification against low precision requirements failed, failing test case." << TestLog::EndMessage;
				return tcu::TestStatus::fail("Image verification failed");
			}
		}
	}

	m_caseNdx += 1;
	return m_caseNdx < (int)m_cases.size() ? tcu::TestStatus::incomplete() : tcu::TestStatus::pass("Pass");
}